

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O0

void __thiscall Js::ScriptContext::InitializeCoreImage_TTD(ScriptContext *this)

{
  HeapAllocator *pHVar1;
  ScriptContextTTD *pSVar2;
  RuntimeContextInfo *pRVar3;
  void *unaff_retaddr;
  undefined1 local_f0 [8];
  EnterScriptObject __enterScriptObject;
  ScriptEntryExitRecord __entryExitRecord;
  ScriptContext *__localScriptContext;
  TrackAllocData local_70;
  code *local_48;
  undefined8 local_40;
  TrackAllocData local_38;
  ScriptContext *local_10;
  ScriptContext *this_local;
  
  local_10 = this;
  if (this->TTDWellKnownInfo != (RuntimeContextInfo *)0x0) {
    TTDAbort_unrecoverable_error("This should only happen once!!!");
  }
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_38,(type_info *)&TTD::ScriptContextTTD::typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
             ,0xc4a);
  pHVar1 = Memory::HeapAllocator::TrackAllocInfo(&Memory::HeapAllocator::Instance,&local_38);
  local_48 = Memory::HeapAllocator::NoThrowAlloc;
  local_40 = 0;
  pSVar2 = (ScriptContextTTD *)new<Memory::HeapAllocator>(0x128,pHVar1,true,0x469be0);
  TTD::ScriptContextTTD::ScriptContextTTD(pSVar2,this);
  pSVar2 = TTD_MEM_ALLOC_CHECK<TTD::ScriptContextTTD>(pSVar2);
  this->TTDContextInfo = pSVar2;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_70,(type_info *)&TTD::RuntimeContextInfo::typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
             ,0xc4b);
  pHVar1 = Memory::HeapAllocator::TrackAllocInfo(&Memory::HeapAllocator::Instance,&local_70);
  pRVar3 = (RuntimeContextInfo *)new<Memory::HeapAllocator>(0x170,pHVar1,true,0x469be0);
  TTD::RuntimeContextInfo::RuntimeContextInfo(pRVar3);
  pRVar3 = TTD_MEM_ALLOC_CHECK<TTD::RuntimeContextInfo>(pRVar3);
  this->TTDWellKnownInfo = pRVar3;
  __enterScriptObject.library = (JavascriptLibrary *)0x0;
  EnterScriptObject::EnterScriptObject
            ((EnterScriptObject *)local_f0,this,
             (ScriptEntryExitRecord *)&__enterScriptObject.library,unaff_retaddr,&stack0x00000000,
             true,true,true);
  OnScriptStart(this,true,true);
  EnterScriptObject::VerifyEnterScript((EnterScriptObject *)local_f0);
  TTD::RuntimeContextInfo::GatherKnownObjectToPathMap(this->TTDWellKnownInfo,this);
  EnterScriptObject::~EnterScriptObject((EnterScriptObject *)local_f0);
  return;
}

Assistant:

void ScriptContext::InitializeCoreImage_TTD()
    {
        TTDAssert(this->TTDWellKnownInfo == nullptr, "This should only happen once!!!");

        this->TTDContextInfo = TT_HEAP_NEW(TTD::ScriptContextTTD, this);
        this->TTDWellKnownInfo = TT_HEAP_NEW(TTD::RuntimeContextInfo);

        BEGIN_ENTER_SCRIPT(this, true, true, true)
        {
            this->TTDWellKnownInfo->GatherKnownObjectToPathMap(this);
        }
        END_ENTER_SCRIPT
    }